

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_png.cpp
# Opt level: O1

bool M_AppendPNGChunk(FILE *file,DWORD chunkID,BYTE *chunkData,DWORD len)

{
  size_t sVar1;
  bool bVar2;
  DWORD crc;
  DWORD head [2];
  uint local_2c;
  uint local_28;
  DWORD local_24;
  
  local_28 = len >> 0x18 | (len & 0xff0000) >> 8 | (len & 0xff00) << 8 | len << 0x18;
  local_24 = chunkID;
  sVar1 = fwrite(&local_28,1,8,(FILE *)file);
  if (sVar1 == 8) {
    if (len != 0) {
      sVar1 = fwrite(chunkData,1,(ulong)len,(FILE *)file);
      if (sVar1 != len) goto LAB_004c6575;
    }
    local_2c = crc32(0,&local_24,4);
    if (len != 0) {
      local_2c = crc32(local_2c,chunkData,len);
    }
    local_2c = local_2c >> 0x18 | (local_2c & 0xff0000) >> 8 | (local_2c & 0xff00) << 8 |
               local_2c << 0x18;
    sVar1 = fwrite(&local_2c,1,4,(FILE *)file);
    bVar2 = sVar1 == 4;
  }
  else {
LAB_004c6575:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool M_AppendPNGChunk (FILE *file, DWORD chunkID, const BYTE *chunkData, DWORD len)
{
	DWORD head[2] = { BigLong((unsigned int)len), chunkID };
	DWORD crc;

	if (fwrite (head, 1, 8, file) == 8 &&
		(len == 0 || fwrite (chunkData, 1, len, file) == len))
	{
		crc = CalcCRC32 ((BYTE *)&head[1], 4);
		if (len != 0)
		{
			crc = AddCRC32 (crc, chunkData, len);
		}
		crc = BigLong((unsigned int)crc);
		return fwrite (&crc, 1, 4, file) == 4;
	}
	return false;
}